

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::SliceHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  double value;
  anon_class_24_1_2f014396_conflict implicitCall;
  uint length_00;
  ScriptContext *scriptContext_00;
  bool bVar2;
  uint32 sliceStart;
  BOOL BVar3;
  Type TVar4;
  int iVar5;
  JavascriptCopyOnAccessNativeIntArray *pJVar6;
  Var pvVar7;
  undefined4 *puVar8;
  RecyclableObject *this_00;
  TypedArrayBase *obj_00;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  JavascriptArray *obj_01;
  JavascriptArray *pJVar9;
  JavascriptNativeIntArray *dstArray;
  JavascriptNativeIntArray *srcArray;
  TypedArrayBase *pTVar10;
  undefined4 extraout_var;
  uint64 uVar11;
  uint64 uVar12;
  JavascriptNativeFloatArray *dstArray_00;
  JavascriptNativeFloatArray *srcArray_00;
  uint uVar13;
  uint uVar14;
  undefined1 auStack_b0 [8];
  Var element;
  ScriptContext *local_a0;
  TypedArrayBase *local_98;
  undefined4 *local_90;
  JavascriptArray *local_88;
  ScriptContext *local_80;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  bool local_33;
  bool local_32;
  bool local_31 [6];
  bool isBuiltinArrayCtor;
  bool isIntArray;
  bool isFloatArray;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  local_98 = typedArrayBase;
  local_80 = scriptContext;
  jsReentLock._24_8_ = obj;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  local_32 = false;
  sliceStart = 0;
  local_31[0] = false;
  local_33 = true;
  if (pArr != (JavascriptArray *)0x0) {
    bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pArr);
    if (bVar2) {
      pJVar6 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pArr);
    }
    else {
      pJVar6 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (pJVar6 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar6);
    }
  }
  length_00 = length;
  if (((ulong)args->Info & 0xfffffe) != 0) {
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar7 = Arguments::operator[](args,1);
    sliceStart = GetFromIndex<unsigned_int>(pvVar7,length,local_80,true);
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
    if (2 < (*(uint *)&args->Info & 0xffffff)) {
      pvVar7 = Arguments::operator[](args,2);
      if (pvVar7 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00b9ec4a;
        *puVar8 = 0;
      }
      if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_00b9ec4a;
        *puVar8 = 0;
      }
      if ((ulong)pvVar7 >> 0x32 == 0 && ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
        this_00 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
        if (this_00 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) goto LAB_00b9ec4a;
          *puVar8 = 0;
        }
        TVar4 = ((this_00->type).ptr)->typeId;
        if (0x57 < (int)TVar4) {
          BVar3 = RecyclableObject::IsExternal(this_00);
          if (BVar3 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) goto LAB_00b9ec4a;
            *puVar8 = 0;
          }
          goto LAB_00b9deed;
        }
      }
      else {
LAB_00b9deed:
        TVar4 = TypeIds_FirstNumberType;
      }
      if (TVar4 != TypeIds_Undefined) {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar7 = Arguments::operator[](args,2);
        length = GetFromIndex<unsigned_int>(pvVar7,length,local_80,true);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
      }
    }
    length_00 = length - sliceStart;
    if (length < sliceStart) {
      length_00 = 0;
    }
  }
  if (pArr == (JavascriptArray *)0x0) {
LAB_00b9dfc1:
    pArr = (JavascriptArray *)0x0;
  }
  else {
    bVar2 = IsNonES5Array((Var)jsReentLock._24_8_);
    if (!bVar2) {
      bVar2 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)jsReentLock._24_8_);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x18f8,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar2) goto LAB_00b9ec4a;
        *puVar8 = 0;
      }
      goto LAB_00b9dfc1;
    }
  }
  BVar3 = TypedArrayBase::IsDetachedTypedArray((Var)jsReentLock._24_8_);
  if (BVar3 != 0) {
    JavascriptError::ThrowTypeError(local_80,-0x7ff5ebe5,L"Array.prototype.slice");
  }
  obj_00 = local_98;
  if ((local_98 == (TypedArrayBase *)0x0 && pArr == (JavascriptArray *)0x0) &&
     (bVar2 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)jsReentLock._24_8_)
     , obj_00 = local_98, bVar2)) {
    obj_00 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>
                       ((RecyclableObject *)jsReentLock._24_8_);
  }
  if (local_98 == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (pArr == (JavascriptArray *)0x0) {
      obj_01 = (JavascriptArray *)
               ArraySpeciesCreate<unsigned_int>
                         ((Var)jsReentLock._24_8_,length_00,local_80,(bool *)0x0,(bool *)0x0,
                          &local_33);
    }
    else {
      obj_01 = (JavascriptArray *)
               ArraySpeciesCreate<unsigned_int>
                         (pArr,length_00,local_80,&local_32,local_31,&local_33);
    }
  }
  else {
    pvVar7 = Arguments::operator[](args,0);
    scriptContext_00 = local_80;
    defaultConstructor = TypedArrayBase::GetDefaultConstructor(pvVar7,local_80);
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    instanceObj = (JavascriptFunction *)
                  JavascriptOperators::SpeciesConstructor
                            ((RecyclableObject *)obj_00,defaultConstructor,scriptContext_00);
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
    local_33 = false;
    if (pArr != (JavascriptArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1910,"(pArr == nullptr)","pArr == nullptr");
      if (bVar2) {
        *puVar8 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_00b9ec4a;
    }
    bVar2 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1911,"(JavascriptOperators::IsConstructor(constructor))",
                                  "JavascriptOperators::IsConstructor(constructor)");
      if (!bVar2) goto LAB_00b9ec4a;
      *puVar8 = 0;
    }
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    this = local_80->threadContext;
    local_a0 = local_80;
    auStack_b0 = (undefined1  [8])instanceObj;
    element._0_4_ = length_00;
    if (instanceObj == defaultConstructor) {
      bVar2 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      pvVar7 = anon_func::anon_class_24_1_2f014396::
               anon_class_24_3_6139f5b6_for_newObjectCreationFunction::operator()
                         ((anon_class_24_3_6139f5b6_for_newObjectCreationFunction *)auStack_b0);
      this->reentrancySafeOrHandled = bVar2;
    }
    else {
      implicitCall.newObjectCreationFunction._12_4_ = element._4_4_;
      implicitCall.newObjectCreationFunction.newLenT = length_00;
      implicitCall.newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
      implicitCall.newObjectCreationFunction.scriptContext = local_80;
      pvVar7 = ThreadContext::
               ExecuteImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime___Language_JavascriptOperators_inl:168:95)>
                         (this,(RecyclableObject *)instanceObj,ImplicitCall_Accessor,implicitCall);
    }
    obj_01 = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar7);
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
  }
  *(bool *)((long)local_78 + 0x108) = true;
  if (obj_01 == (JavascriptArray *)0x0) {
    if (pArr != (JavascriptArray *)0x0) {
      GetArrayTypeAndConvert(pArr,&local_32,local_31);
    }
    obj_01 = CreateNewArrayHelper(length_00,local_32,local_31[0],pArr,local_80);
    if (obj_01 != (JavascriptArray *)0x0) {
      bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(obj_01);
      if (bVar2) {
        pJVar6 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(obj_01);
      }
      else {
        pJVar6 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (pJVar6 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar6);
      }
    }
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_78,obj_01);
    local_88 = obj_01;
  }
  else {
    bVar2 = IsNonES5Array(obj_01);
    if (bVar2) {
      pJVar9 = UnsafeVarTo<Js::JavascriptArray>(obj_01);
    }
    else {
      pJVar9 = (JavascriptArray *)0x0;
    }
    if (pJVar9 == (JavascriptArray *)0x0) {
      local_88 = (JavascriptArray *)0x0;
    }
    else {
      bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar9);
      if (bVar2) {
        pJVar6 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar9);
      }
      else {
        pJVar6 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      local_88 = pJVar9;
      if (pJVar6 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar6);
      }
    }
  }
  if (obj_01 == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x194f,"(newObj)","newObj");
    if (!bVar2) goto LAB_00b9ec4a;
    *puVar8 = 0;
  }
  if (length_00 == 0) goto LAB_00b9e830;
  if (pArr == (JavascriptArray *)0x0) {
LAB_00b9e364:
    pArr = (JavascriptArray *)0x0;
  }
  else {
    bVar2 = IsNonES5Array((Var)jsReentLock._24_8_);
    if (!bVar2) {
      bVar2 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)jsReentLock._24_8_);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x195b,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar2) goto LAB_00b9ec4a;
        *puVar8 = 0;
      }
      goto LAB_00b9e364;
    }
  }
  if (pArr == (JavascriptArray *)0x0) {
    if (obj_00 == (TypedArrayBase *)0x0) goto LAB_00b9e459;
    bVar2 = VarIsCorrectType<Js::TypedArrayBase>(obj_00);
    if (!bVar2) {
      bVar2 = VarIsCorrectType<Js::TypedArrayBase>(obj_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x19bd,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar2) goto LAB_00b9ec4a;
        *puVar8 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar2 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)obj_01);
    pJVar9 = local_88;
    if (bVar2) {
      pTVar10 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)obj_01);
    }
    else {
      pTVar10 = (TypedArrayBase *)0x0;
    }
    if (pJVar9 == (JavascriptArray *)0x0 && pTVar10 == (TypedArrayBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x19c4,"(newArr != nullptr)","newArr != nullptr");
      if (bVar2) {
        *puVar8 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_00b9ec4a;
    }
    uVar13 = 0;
    do {
      if ((local_98 != (TypedArrayBase *)0x0) ||
         (iVar5 = (*(obj_00->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x24])(obj_00,(ulong)(sliceStart + uVar13)),
         iVar5 == 1)) {
        iVar5 = (*(obj_00->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(obj_00,(ulong)(sliceStart + uVar13));
        if (pTVar10 == (TypedArrayBase *)0x0) {
          (*(local_88->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_88,(ulong)uVar13,CONCAT44(extraout_var,iVar5),0);
        }
        else {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          (*(pTVar10->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(pTVar10,(ulong)uVar13,CONCAT44(extraout_var,iVar5));
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          *(bool *)((long)local_78 + 0x108) = true;
        }
      }
      uVar13 = uVar13 + 1;
    } while (length_00 + (length_00 == 0) != uVar13);
  }
  else {
    bVar2 = HasAnyES5ArrayInPrototypeChain(pArr,false);
    if (bVar2) {
LAB_00b9e459:
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      SliceObjectHelper((RecyclableObject *)jsReentLock._24_8_,sliceStart,0,local_88,
                        (RecyclableObject *)obj_01,length_00,local_80);
      goto LAB_00b9e830;
    }
    if ((local_88 == (JavascriptArray *)0x0) || (local_33 != true)) {
      local_90 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar13 = 0;
      do {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        iVar5 = (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x71])(pArr,(ulong)(sliceStart + uVar13),auStack_b0);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        if (iVar5 == 0) {
          iVar5 = 0x15;
        }
        else {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar5 = (*(obj_01->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x29])(obj_01,(ulong)uVar13,auStack_b0,4);
          ThrowErrorOnFailure(iVar5,local_80,uVar13);
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          *(bool *)((long)local_78 + 0x108) = true;
          bVar2 = IsNonES5Array((Var)jsReentLock._24_8_);
          iVar5 = 0;
          if (!bVar2) {
            bVar2 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)jsReentLock._24_8_)
            ;
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_90 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x19b5,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar2) goto LAB_00b9ec4a;
              *local_90 = 0;
            }
            *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            iVar5 = 1;
            SliceObjectHelper((RecyclableObject *)jsReentLock._24_8_,sliceStart,uVar13 + 1,local_88,
                              (RecyclableObject *)obj_01,length_00,local_80);
          }
        }
        if ((iVar5 != 0x15) && (iVar5 != 0)) goto LAB_00b9e614;
        uVar13 = uVar13 + 1;
      } while (length_00 + (length_00 == 0) != uVar13);
      iVar5 = 0x13;
LAB_00b9e614:
      if ((iVar5 != 0) && (iVar5 != 0x13)) goto LAB_00b9e830;
    }
    else {
      bVar2 = IsDirectAccessArray(local_88);
      if (bVar2) {
        uVar13 = sliceStart + length_00;
        if ((((pArr->head).ptr)->length < uVar13) || (((local_88->head).ptr)->size < length_00)) {
          if (local_32 == true) {
            *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            dstArray = VarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(local_88);
            srcArray = VarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
            CopyNativeIntArrayElements(dstArray,0,srcArray,sliceStart,uVar13);
            JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          }
          else {
            *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            if (local_31[0] == true) {
              dstArray_00 = VarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(local_88);
              srcArray_00 = VarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr);
              CopyNativeFloatArrayElements(dstArray_00,0,srcArray_00,sliceStart,uVar13);
              JsReentLock::MutateArrayObject((JsReentLock *)local_78);
            }
            else {
              CopyArrayElements(local_88,0,pArr,sliceStart,uVar13);
              JsReentLock::MutateArrayObject((JsReentLock *)local_78);
            }
          }
        }
        else if (local_32 == true) {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          SliceHelper<int>(pArr,local_88,sliceStart,length_00);
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        }
        else {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (local_31[0] == true) {
            SliceHelper<double>(pArr,local_88,sliceStart,length_00);
            JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          }
          else {
            SliceHelper<void*>(pArr,local_88,sliceStart,length_00);
            JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          }
        }
        *(bool *)((long)local_78 + 0x108) = true;
      }
      else {
        if (DAT_015b5f99 == '\0') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x198c,"((Js::Configuration::Global.flags.ForceES5Array))",
                                      "newArr can only be ES5Array when it is forced");
          if (!bVar2) goto LAB_00b9ec4a;
          *puVar8 = 0;
        }
        local_90 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar13 = 0;
        do {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar5 = (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x71])
                            (pArr,(ulong)(sliceStart + uVar13),auStack_b0);
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          *(bool *)((long)local_78 + 0x108) = true;
          if (iVar5 == 0) {
            uVar14 = 0x10;
          }
          else {
            (*(local_88->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x29])(local_88,(ulong)uVar13,auStack_b0,0);
            bVar2 = IsNonES5Array((Var)jsReentLock._24_8_);
            uVar14 = 0;
            if (!bVar2) {
              bVar2 = VarIs<Js::ES5Array,Js::RecyclableObject>
                                ((RecyclableObject *)jsReentLock._24_8_);
              if (!bVar2) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *local_90 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                            ,0x199c,"(VarIs<ES5Array>(obj))",
                                            "The array should have been converted to an ES5Array");
                if (!bVar2) goto LAB_00b9ec4a;
                *local_90 = 0;
              }
              *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              uVar14 = 1;
              SliceObjectHelper((RecyclableObject *)jsReentLock._24_8_,sliceStart,uVar13 + 1,
                                local_88,(RecyclableObject *)obj_01,length_00,local_80);
            }
          }
          if ((uVar14 & 0xf) != 0) goto LAB_00b9ea0c;
          uVar13 = uVar13 + 1;
        } while (length_00 + (length_00 == 0) != uVar13);
        uVar14 = 0xe;
LAB_00b9ea0c:
        if ((uVar14 != 0) && (uVar14 != 0xe)) goto LAB_00b9e830;
      }
    }
  }
  if (local_98 == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if ((int)length_00 < 0) {
      value = (double)length_00;
      uVar11 = NumberUtilities::ToSpecial(value);
      bVar2 = NumberUtilities::IsNan(value);
      if (((bVar2) && (uVar12 = NumberUtilities::ToSpecial(value), uVar12 != 0xfff8000000000000)) &&
         (uVar12 = NumberUtilities::ToSpecial(value), uVar12 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) {
LAB_00b9ec4a:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
      }
      pvVar7 = (Var)(uVar11 ^ 0xfffc000000000000);
    }
    else {
      pvVar7 = (Var)((ulong)length_00 | 0x1000000000000);
    }
    JavascriptOperators::SetProperty
              (obj_01,(RecyclableObject *)obj_01,0xd1,pvVar7,local_80,
               PropertyOperation_ThrowIfNotExtensible);
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
  }
  bVar2 = IsNonES5Array(obj_01);
  if (bVar2) {
    pJVar9 = UnsafeVarTo<Js::JavascriptArray>(obj_01);
  }
  else {
    pJVar9 = (JavascriptArray *)0x0;
  }
  if (pJVar9 != (JavascriptArray *)0x0) {
    (*(pJVar9->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
LAB_00b9e830:
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return obj_01;
}

Assistant:

Var JavascriptArray::SliceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        JavascriptArray* newArr = nullptr;
        RecyclableObject* newObj = nullptr;
        bool isIntArray = false;
        bool isFloatArray = false;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;
        T startT = 0;
        T newLenT = length;
        T endT = length;

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pArr);
#endif
        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, startT = GetFromIndex(args[1], length, scriptContext));

            if (args.Info.Count > 2 && JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
            {
                JS_REENTRANT(jsReentLock, endT = GetFromIndex(args[2], length, scriptContext));
            }

            newLenT = endT > startT ? endT - startT : 0;
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of arguments start or end may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (TypedArrayBase::IsDetachedTypedArray(obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("Array.prototype.slice"));
        }

        // If we came from Array.prototype.slice and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.slice or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));
            isBuiltinArrayCtor = false;

            AssertAndFailFast(pArr == nullptr);
            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(newLenT, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)newLenT, scriptContext);
                    }));
            );
        }

        else if (pArr != nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(pArr, newLenT, scriptContext, &isIntArray, &isFloatArray, &isBuiltinArrayCtor));
        }

        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, newLenT, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        // If we didn't create a new object above we will create a new array here.
        // This is the pre-ES6 behavior or the case of calling Array.prototype.slice with a constructor argument that is not a constructor function.
        if (newObj == nullptr)
        {
            if (pArr)
            {
                pArr->GetArrayTypeAndConvert(&isIntArray, &isFloatArray);
            }

            if (newLenT > JavascriptArray::MaxArrayLength)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }

            newArr = CreateNewArrayHelper(static_cast<uint32>(newLenT), isIntArray, isFloatArray, pArr, scriptContext);
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
            newObj = newArr;
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
            }
        }

        uint32 start  = (uint32) startT;
        uint32 newLen = (uint32) newLenT;

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // Bail out early if the new object will have zero length.
        if (newLen == 0)
        {
            return newObj;
        }

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            if (HasAnyES5ArrayInPrototypeChain(pArr))
            {
                JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, 0u, newArr, newObj, newLen, scriptContext));
            }

            // If we constructed a new Array object, we have some nice helpers here
            if (newArr && isBuiltinArrayCtor)
            {
                if (JavascriptArray::IsDirectAccessArray(newArr))
                {
                    if (((start + newLen) <= pArr->head->length) && newLen <= newArr->head->size) //Fast Path
                    {
                        if (isIntArray)
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<int32>(pArr, newArr, start, newLen));
                        }
                        else if (isFloatArray)
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<double>(pArr, newArr, start, newLen));
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<Var>(pArr, newArr, start, newLen));
                        }
                    }
                    else
                    {
                        if (isIntArray)
                        {
                            JS_REENTRANT(jsReentLock, CopyNativeIntArrayElements(VarTo<JavascriptNativeIntArray>(newArr), 0, VarTo<JavascriptNativeIntArray>(pArr), start, start + newLen));
                        }
                        else if (isFloatArray)
                        {
                            JS_REENTRANT(jsReentLock, CopyNativeFloatArrayElements(VarTo<JavascriptNativeFloatArray>(newArr), 0, VarTo<JavascriptNativeFloatArray>(pArr), start, start + newLen));
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, CopyArrayElements(newArr, 0u, pArr, start, start + newLen));
                        }
                    }
                }
                else
                {
                    AssertMsg(CONFIG_FLAG(ForceES5Array), "newArr can only be ES5Array when it is forced");
                    Var element;
                    for (uint32 i = 0; i < newLen; i++)
                    {
                        JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                        if (!gotItem)
                        {
                            continue;
                        }

                        newArr->SetItem(i, element, PropertyOperation_None);

                        // Side-effects in the prototype lookup may have changed the source array into an ES5Array. If this happens
                        // we will process the rest of the array elements like an ES5Array.
                        if (!JavascriptArray::IsNonES5Array(obj))
                        {
                            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, i + 1, newArr, newObj, newLen, scriptContext));
                        }
                    }
                }
            }
            else
            {
                // The constructed object isn't an array, we'll need to use normal object manipulation
                Var element;

                for (uint32 i = 0; i < newLen; i++)
                {
                    JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                    if (!gotItem)
                    {
                        continue;
                    }

                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));

                    // Side-effects in the prototype lookup may have changed the source array into an ES5Array. If this happens
                    // we will process the rest of the array elements like an ES5Array.
                    if (!JavascriptArray::IsNonES5Array(obj))
                    {
                        AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, i + 1, newArr, newObj, newLen, scriptContext));
                    }
                }
            }
        }
        else if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we must have created the return object via a call to constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Var element;

            for (uint32 i = 0; i < newLen; i++)
            {
                // We only need to call HasItem in the case that we are called from Array.prototype.slice
                if (!isTypedArrayEntryPoint && !typedArrayBase->HasItem(i + start))
                {
                    continue;
                }

                element = typedArrayBase->DirectGetItem(i + start);

                // The object we got back from the constructor might not be a TypedArray. In fact, it could be any object.
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(i, element));
                }
                else
                {
                    newArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, 0u, newArr, newObj, newLen, scriptContext));;
        }

        if (!isTypedArrayEntryPoint)
        {
            JS_REENTRANT(jsReentLock, JavascriptOperators::SetProperty(newObj, newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));
        }

#ifdef VALIDATE_ARRAY
        JavascriptArray * jsArr = JavascriptArray::TryVarToNonES5Array(newObj);
        if (jsArr)
        {
            jsArr->ValidateArray();
        }
#endif

        return newObj;
    }